

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

int __thiscall QTextEdit::fontWeight(QTextEdit *this)

{
  int iVar1;
  long in_FS_OFFSET;
  QTextEditPrivate *d;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QTextCursor *this_00;
  QTextCursor local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTextEdit *)0x6d1505);
  this_00 = local_20;
  QWidgetTextControl::textCursor((QWidgetTextControl *)this_00);
  QTextCursor::charFormat();
  iVar1 = QTextCharFormat::fontWeight
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x6d154e);
  QTextCursor::~QTextCursor(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QTextEdit::fontWeight() const
{
    Q_D(const QTextEdit);
    return d->control->textCursor().charFormat().fontWeight();
}